

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O0

CTcCodeLabel * CTcPrsNode::gen_jump_ahead(uchar opc)

{
  int iVar1;
  undefined1 in_DIL;
  CTcCodeLabel *lbl;
  uchar in_stack_000000df;
  CTcGenTarg *in_stack_000000e0;
  undefined7 in_stack_fffffffffffffff0;
  undefined8 local_8;
  
  iVar1 = CTcGenTarg::can_skip_op(G_cg);
  if (iVar1 == 0) {
    CTcGenTarg::write_op(in_stack_000000e0,in_stack_000000df);
    local_8 = CTcCodeStream::new_label_fwd
                        ((CTcCodeStream *)CONCAT17(in_DIL,in_stack_fffffffffffffff0));
    CTcCodeStream::write_ofs2((CTcCodeStream *)CONCAT17(in_DIL,in_stack_fffffffffffffff0),local_8,0)
    ;
  }
  else {
    local_8 = (CTcCodeLabel *)0x0;
  }
  return local_8;
}

Assistant:

CTcCodeLabel *CTcPrsNode::gen_jump_ahead(uchar opc)
{
    /* 
     *   check to see if we should suppress the jump for peephole
     *   optimization 
     */
    if (G_cg->can_skip_op())
        return 0;

    /* emit the opcode */
    G_cg->write_op(opc);

    /* allocate a new label */
    CTcCodeLabel *lbl = G_cs->new_label_fwd();

    /* 
     *   write the forward offset to the label (this will generate a fixup
     *   record attached to the label, so that we'll come back and fix it
     *   up when the real offset is known) 
     */
    G_cs->write_ofs2(lbl, 0);

    /* return the forward label */
    return lbl;
}